

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool Curl_ssl_config_matches(ssl_config_data *data,ssl_config_data *needle)

{
  _Bool _Var1;
  
  if (((((data->version == needle->version) && (data->verifypeer == needle->verifypeer)) &&
       (data->verifyhost == needle->verifyhost)) &&
      ((_Var1 = safe_strequal(data->CApath,needle->CApath), _Var1 &&
       (_Var1 = safe_strequal(data->CAfile,needle->CAfile), _Var1)))) &&
     ((_Var1 = safe_strequal(data->random_file,needle->random_file), _Var1 &&
      ((_Var1 = safe_strequal(data->egdsocket,needle->egdsocket), _Var1 &&
       (_Var1 = safe_strequal(data->cipher_list,needle->cipher_list), _Var1)))))) {
    return true;
  }
  return false;
}

Assistant:

bool
Curl_ssl_config_matches(struct ssl_config_data* data,
                        struct ssl_config_data* needle)
{
  if((data->version == needle->version) &&
     (data->verifypeer == needle->verifypeer) &&
     (data->verifyhost == needle->verifyhost) &&
     safe_strequal(data->CApath, needle->CApath) &&
     safe_strequal(data->CAfile, needle->CAfile) &&
     safe_strequal(data->random_file, needle->random_file) &&
     safe_strequal(data->egdsocket, needle->egdsocket) &&
     safe_strequal(data->cipher_list, needle->cipher_list))
    return TRUE;

  return FALSE;
}